

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestring_test.cc
# Opt level: O0

void anon_unknown.dwarf_a4ae0::ExpectBerConvert
               (char *name,Span<const_unsigned_char> der_expected,Span<const_unsigned_char> ber)

{
  Span<const_unsigned_char> span;
  Span<const_unsigned_char> span_00;
  Span<const_unsigned_char> span_01;
  Span<const_unsigned_char> span_02;
  Span<const_unsigned_char> span_03;
  bool bVar1;
  uchar *data;
  size_t sVar2;
  char *pcVar3;
  uint8_t *data_arg;
  size_t sVar4;
  char *in_R9;
  AssertHelper local_1d8;
  Message local_1d0;
  char *local_1c8;
  uchar *puStack_1c0;
  Bytes local_1b8;
  size_t local_1a8;
  size_t sStack_1a0;
  Bytes local_198;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  char *local_168;
  uchar *puStack_160;
  Bytes local_158;
  size_t local_148;
  size_t sStack_140;
  Bytes local_138;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_1;
  Message local_110;
  Bytes local_108;
  size_t local_f8;
  size_t sStack_f0;
  Bytes local_e8;
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  UniquePtr<uint8_t> scoper;
  string local_b8;
  AssertHelper local_98;
  Message local_90;
  int local_84;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_;
  pointer local_60;
  uint8_t *storage;
  CBS out;
  CBS in;
  ScopedTrace gtest_trace_623;
  char *name_local;
  Span<const_unsigned_char> ber_local;
  Span<const_unsigned_char> der_expected_local;
  
  ber_local.data_ = (uchar *)ber.size_;
  name_local = (char *)ber.data_;
  sVar4 = der_expected.size_;
  ber_local.size_ = (size_t)der_expected.data_;
  testing::ScopedTrace::ScopedTrace
            ((ScopedTrace *)((long)&in.len + 7),
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
             ,0x26f,name);
  data = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&name_local);
  sVar2 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&name_local);
  CBS_init((CBS *)&out.len,data,sVar2);
  local_84 = CBS_asn1_ber_to_der((CBS *)&out.len,(CBS *)&storage,&local_60);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_80,&local_84,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b8,(internal *)local_80,
               (AssertionResult *)"CBS_asn1_ber_to_der(&in, &out, &storage)","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
               ,0x274,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  if (bVar1) {
    std::unique_ptr<unsigned_char,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<unsigned_char,bssl::internal::Deleter> *)&gtest_ar.message_,local_60);
    local_f8 = ber_local.size_;
    span_03.size_ = sVar4;
    span_03.data_ = (uchar *)ber_local.size_;
    sStack_f0 = sVar4;
    Bytes::Bytes(&local_e8,span_03);
    data_arg = CBS_data((CBS *)&storage);
    sVar2 = CBS_len((CBS *)&storage);
    Bytes::Bytes(&local_108,data_arg,sVar2);
    testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
              ((EqHelper *)local_d8,"Bytes(der_expected)","Bytes(CBS_data(&out), CBS_len(&out))",
               &local_e8,&local_108);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
    if (!bVar1) {
      testing::Message::Message(&local_110);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                 ,0x277,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
    if (local_60 == (pointer)0x0) {
      local_1a8 = ber_local.size_;
      span_00.size_ = sVar4;
      span_00.data_ = (uchar *)ber_local.size_;
      sStack_1a0 = sVar4;
      Bytes::Bytes(&local_198,span_00);
      local_1c8 = name_local;
      puStack_1c0 = ber_local.data_;
      span.size_ = (size_t)ber_local.data_;
      span.data_ = (uchar *)name_local;
      Bytes::Bytes(&local_1b8,span);
      testing::internal::EqHelper::Compare<Bytes,_Bytes,_nullptr>
                ((EqHelper *)local_188,"Bytes(der_expected)","Bytes(ber)",&local_198,&local_1b8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
      if (!bVar1) {
        testing::Message::Message(&local_1d0);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x27b,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
        testing::internal::AssertHelper::~AssertHelper(&local_1d8);
        testing::Message::~Message(&local_1d0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    }
    else {
      local_148 = ber_local.size_;
      span_02.size_ = sVar4;
      span_02.data_ = (uchar *)ber_local.size_;
      sStack_140 = sVar4;
      Bytes::Bytes(&local_138,span_02);
      local_168 = name_local;
      puStack_160 = ber_local.data_;
      span_01.size_ = (size_t)ber_local.data_;
      span_01.data_ = (uchar *)name_local;
      Bytes::Bytes(&local_158,span_01);
      testing::internal::CmpHelperNE<Bytes,Bytes>
                ((internal *)local_128,"Bytes(der_expected)","Bytes(ber)",&local_138,&local_158);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
      if (!bVar1) {
        testing::Message::Message(&local_170);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/bytestring_test.cc"
                   ,0x279,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_170);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_170);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    }
    std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<unsigned_char,_bssl::internal::Deleter> *)&gtest_ar.message_);
  }
  testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&in.len + 7));
  return;
}

Assistant:

static void ExpectBerConvert(const char *name,
                             bssl::Span<const uint8_t> der_expected,
                             bssl::Span<const uint8_t> ber) {
  SCOPED_TRACE(name);
  CBS in, out;
  uint8_t *storage;

  CBS_init(&in, ber.data(), ber.size());
  ASSERT_TRUE(CBS_asn1_ber_to_der(&in, &out, &storage));
  bssl::UniquePtr<uint8_t> scoper(storage);

  EXPECT_EQ(Bytes(der_expected), Bytes(CBS_data(&out), CBS_len(&out)));
  if (storage != nullptr) {
    EXPECT_NE(Bytes(der_expected), Bytes(ber));
  } else {
    EXPECT_EQ(Bytes(der_expected), Bytes(ber));
  }
}